

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O2

void __thiscall
cmIncludeDirectoryCommand::NormalizeInclude(cmIncludeDirectoryCommand *this,string *inc)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  allocator local_41;
  string tmp;
  
  uVar2 = std::__cxx11::string::find_first_not_of((char *)inc,0x51b276);
  lVar3 = std::__cxx11::string::find_last_not_of((char *)inc,0x51b276);
  if (lVar3 != -1 && uVar2 != 0xffffffffffffffff) {
    std::__cxx11::string::assign((string *)inc,(ulong)inc,uVar2);
    bVar1 = cmSystemTools::IsOff((inc->_M_dataplus)._M_p);
    if (!bVar1) {
      cmsys::SystemTools::ConvertToUnixSlashes(inc);
      bVar1 = cmsys::SystemTools::FileIsFullPath((inc->_M_dataplus)._M_p);
      if ((!bVar1) && ((pcVar4 = (inc->_M_dataplus)._M_p, *pcVar4 != '$' || (pcVar4[1] != '<')))) {
        pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::string((string *)&tmp,pcVar4,&local_41);
        std::__cxx11::string::append((char *)&tmp);
        std::__cxx11::string::append((string *)&tmp);
        std::__cxx11::string::_M_assign((string *)inc);
        std::__cxx11::string::~string((string *)&tmp);
      }
    }
    return;
  }
  std::__cxx11::string::assign((char *)inc);
  return;
}

Assistant:

void cmIncludeDirectoryCommand::NormalizeInclude(std::string& inc)
{
  std::string::size_type b = inc.find_first_not_of(" \r");
  std::string::size_type e = inc.find_last_not_of(" \r");
  if ((b != std::string::npos) && (e != std::string::npos)) {
    inc.assign(inc, b, 1 + e - b); // copy the remaining substring
  } else {
    inc = "";
    return;
  }

  if (!cmSystemTools::IsOff(inc.c_str())) {
    cmSystemTools::ConvertToUnixSlashes(inc);

    if (!cmSystemTools::FileIsFullPath(inc.c_str())) {
      if (!StartsWithGeneratorExpression(inc)) {
        std::string tmp = this->Makefile->GetCurrentSourceDirectory();
        tmp += "/";
        tmp += inc;
        inc = tmp;
      }
    }
  }
}